

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-dark.c
# Opt level: O3

void borg_flow_direct(int y,int x)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  _Bool _Var4;
  wchar_t wVar5;
  uint uVar6;
  wchar_t wVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  wchar_t wVar12;
  uint uVar13;
  wchar_t wVar14;
  wchar_t wVar15;
  uint uVar16;
  uint8_t *puVar17;
  borg_grid *ag;
  uint uVar18;
  int local_50;
  int local_4c;
  
  if (borg_data_icky->data[(uint)y][(uint)x] == '\0') {
    if (borg_data_know->data[(uint)y][(uint)x] == '\0') {
      borg_data_know->data[(uint)y][(uint)x] = '\x01';
      wVar5 = borg_danger(y,x,L'\x01',true,false);
      iVar8 = (int)avoidance;
      if (borg.trait[0x24] == 0x32) {
        wVar15 = (int)(short)(avoidance - (avoidance >> 0xf)) >> 1;
      }
      else {
        wVar15 = (iVar8 * 3) / 10;
      }
      wVar7 = iVar8 * 2;
      if (scaryguy_on_level == false) {
        wVar7 = wVar15;
      }
      if (((unique_on_level != 0) && (vault_on_level == true)) && (borg.trait[0x24] == 0x32)) {
        wVar7 = iVar8 * 3;
      }
      wVar15 = iVar8 * 3;
      if (scaryguy_on_level == false) {
        wVar15 = wVar7;
      }
      if (5 < borg.trait[0x23]) {
        wVar15 = wVar7;
      }
      if (borg.goal.ignoring != false) {
        wVar15 = iVar8 * 5;
      }
      wVar7 = iVar8 * 0x19;
      if (borg_t - borg_began < 0x1389) {
        wVar7 = wVar15;
      }
      wVar15 = iVar8 * 100;
      if (borg.trait[0x27] != 0) {
        wVar15 = wVar7;
      }
      if (borg.trait[0x23] == 0) {
        wVar15 = iVar8 / 10;
      }
      if (wVar15 < wVar5) {
        puVar17 = borg_data_icky->data[(uint)y] + (uint)x;
LAB_00217272:
        *puVar17 = '\x01';
        return;
      }
    }
    borg_data_cost->data[(uint)y][(uint)x] = '\0';
    iVar3 = borg.c.y;
    iVar8 = borg.c.x;
    uVar6 = borg.c.y - y;
    uVar1 = -uVar6;
    if (0 < (int)uVar6) {
      uVar1 = uVar6;
    }
    uVar9 = borg.c.x - x;
    uVar2 = -uVar9;
    if (0 < (int)uVar9) {
      uVar2 = uVar9;
    }
    if (borg.c.y != y || borg.c.x != x) {
      uVar13 = y - borg.c.y;
      if (y - borg.c.y <= (int)uVar6) {
        uVar13 = uVar6;
      }
      local_4c = ((int)((uVar2 - ((int)(uVar2 - 1) >> 0x1f)) + -1) >> 1) + uVar13;
      uVar6 = x - borg.c.x;
      if (x - borg.c.x <= (int)uVar9) {
        uVar6 = uVar9;
      }
      local_50 = ((int)((uVar1 - ((int)(uVar1 - 1) >> 0x1f)) + -1) >> 1) + uVar6;
      uVar18 = 1;
      uVar9 = 0xffffffff;
      do {
        if (uVar2 < uVar1) {
          uVar10 = -(local_50 / (int)uVar1);
          if (x <= iVar8) {
            uVar10 = local_50 / (int)uVar1;
          }
          uVar16 = uVar18;
          if (iVar3 < y) {
            uVar16 = uVar9;
          }
        }
        else {
          uVar16 = -(local_4c / (int)uVar2);
          if (y <= iVar3) {
            uVar16 = local_4c / (int)uVar2;
          }
          uVar10 = uVar18;
          if (iVar8 < x) {
            uVar10 = uVar9;
          }
        }
        wVar15 = uVar16 + y;
        wVar5 = uVar10 + x;
        ag = borg_grids[wVar15] + wVar5;
        _Var4 = borg_cave_floor_grid(ag);
        if (!_Var4) {
          return;
        }
        if ((ag->feat == '\x17') && (borg.trait[0x40] == 0)) {
          return;
        }
        if (((ag->trap == true) && ((int)avoidance <= borg.trait[0x1b])) &&
           (scaryguy_on_level == false)) {
          if (borg.trait[0x1b] < 0x3c) {
            return;
          }
          if (borg.trait[0x36] < 0x1e) {
            if (borg.trait[0x23] < 0x14) {
              return;
            }
          }
          else if (((uint)borg.trait[0x36] < 0x2d) && (borg.trait[0x23] < 10)) {
            return;
          }
          if (borg.trait[0x37] < 0x1e) {
            if (borg.trait[0x23] < 0x14) {
              return;
            }
          }
          else if (((uint)borg.trait[0x37] < 0x2d) && (borg.trait[0x23] < 10)) {
            return;
          }
        }
        if (borg_data_icky->data[wVar15][wVar5] != '\0') {
          return;
        }
        if (borg_data_know->data[wVar15][wVar5] == '\0') {
          borg_data_know->data[wVar15][wVar5] = '\x01';
          wVar7 = borg_danger(wVar15,wVar5,L'\x01',true,false);
          iVar11 = (int)avoidance;
          if (borg.trait[0x24] == 0x32) {
            wVar14 = (int)(short)(avoidance - (avoidance >> 0xf)) >> 1;
          }
          else {
            wVar14 = (iVar11 * 3) / 10;
          }
          wVar12 = iVar11 * 2;
          if (scaryguy_on_level == false) {
            wVar12 = wVar14;
          }
          if (((unique_on_level != 0) && (vault_on_level == true)) && (borg.trait[0x24] == 0x32)) {
            wVar12 = iVar11 * 3;
          }
          wVar14 = iVar11 * 3;
          if (scaryguy_on_level == false) {
            wVar14 = wVar12;
          }
          if (5 < borg.trait[0x23]) {
            wVar14 = wVar12;
          }
          if (borg.goal.ignoring != false) {
            wVar14 = iVar11 * 5;
          }
          wVar12 = iVar11 * 0x19;
          if (borg_t - borg_began < 0x1389) {
            wVar12 = wVar14;
          }
          wVar14 = iVar11 * 100;
          if (borg.trait[0x27] != 0) {
            wVar14 = wVar12;
          }
          if (borg.trait[0x23] == 0) {
            wVar14 = iVar11 / 10;
          }
          if (wVar14 < wVar7) {
            puVar17 = borg_data_icky->data[wVar15] + wVar5;
            goto LAB_00217272;
          }
        }
        if (borg_data_cost->data[wVar15][wVar5] <= uVar18) {
          return;
        }
        borg_data_cost->data[wVar15][wVar5] = (uint8_t)uVar18;
        uVar18 = uVar18 + 1;
        local_4c = local_4c + uVar13;
        local_50 = local_50 + uVar6;
        uVar9 = uVar9 - 1;
      } while ((wVar5 != iVar8) || (wVar15 != iVar3));
    }
  }
  return;
}

Assistant:

static void borg_flow_direct(int y, int x)
{
    int n = 0;

    int x1, y1, x2, y2;

    int ay, ax;

    int shift;

    int p, fear = 0;

    borg_grid *ag;

    /* Avoid icky grids */
    if (borg_data_icky->data[y][x])
        return;

    /* Unknown */
    if (!borg_data_know->data[y][x]) {
        /* Mark as known */
        borg_data_know->data[y][x] = true;

        /* Get the danger */
        p = borg_danger(y, x, 1, true, false);

        /* Increase bravery */
        if (borg.trait[BI_MAXCLEVEL] == 50)
            fear = avoidance * 5 / 10;
        if (borg.trait[BI_MAXCLEVEL] != 50)
            fear = avoidance * 3 / 10;
        if (scaryguy_on_level)
            fear = avoidance * 2;
        if (unique_on_level && vault_on_level && borg.trait[BI_MAXCLEVEL] == 50)
            fear = avoidance * 3;
        if (scaryguy_on_level && borg.trait[BI_CLEVEL] <= 5)
            fear = avoidance * 3;
        if (borg.goal.ignoring)
            fear = avoidance * 5;
        if (borg_t - borg_began > 5000)
            fear = avoidance * 25;
        if (borg.trait[BI_FOOD] == 0)
            fear = avoidance * 100;

        /* Normal in town */
        if (borg.trait[BI_CLEVEL] == 0)
            fear = avoidance * 1 / 10;

        /* Mark dangerous grids as icky */
        if (p > fear) {
            /* Icky */
            borg_data_icky->data[y][x] = true;

            /* Avoid */
            return;
        }
    }

    /* Save the flow cost (zero) */
    borg_data_cost->data[y][x] = 0;

    /* Save "origin" */
    y1 = y;
    x1 = x;

    /* Save "destination" */
    y2 = borg.c.y;
    x2 = borg.c.x;

    /* Calculate distance components */
    ay = (y2 < y1) ? (y1 - y2) : (y2 - y1);
    ax = (x2 < x1) ? (x1 - x2) : (x2 - x1);

    /* Path */
    while (1) {
        /* Check for arrival at player */
        if ((x == x2) && (y == y2))
            return;

        /* Next */
        n++;

        /* Move mostly vertically */
        if (ay > ax) {
            /* Extract a shift factor XXX */
            shift = (n * ax + (ay - 1) / 2) / ay;

            /* Sometimes move along the minor axis */
            x = (x2 < x1) ? (x1 - shift) : (x1 + shift);

            /* Always move along major axis */
            y = (y2 < y1) ? (y1 - n) : (y1 + n);
        }

        /* Move mostly horizontally */
        else {
            /* Extract a shift factor XXX */
            shift = (n * ay + (ax - 1) / 2) / ax;

            /* Sometimes move along the minor axis */
            y = (y2 < y1) ? (y1 - shift) : (y1 + shift);

            /* Always move along major axis */
            x = (x2 < x1) ? (x1 - n) : (x1 + n);
        }

        /* Access the grid */
        ag = &borg_grids[y][x];

        /* Ignore "wall" grids and lava (unless immune to fire) */
        if (!borg_cave_floor_grid(ag)
            || (ag->feat == FEAT_LAVA && !borg.trait[BI_IFIRE]))
            return;

        /* Avoid Traps if low level-- unless brave or scaryguy. */
        if (ag->trap && avoidance <= borg.trait[BI_CURHP]
            && !scaryguy_on_level) {
            /* Do not disarm when you could end up dead */
            if (borg.trait[BI_CURHP] < 60)
                return;

            /* Do not disarm when clumsy */
            if (borg.trait[BI_DISP] < 30 && borg.trait[BI_CLEVEL] < 20)
                return;
            if (borg.trait[BI_DISP] < 45 && borg.trait[BI_CLEVEL] < 10)
                return;
            if (borg.trait[BI_DISM] < 30 && borg.trait[BI_CLEVEL] < 20)
                return;
            if (borg.trait[BI_DISM] < 45 && borg.trait[BI_CLEVEL] < 10)
                return;
        }

        /* Abort at "icky" grids */
        if (borg_data_icky->data[y][x])
            return;

        /* Analyze every grid once */
        if (!borg_data_know->data[y][x]) {
            /* Mark as known */
            borg_data_know->data[y][x] = true;

            /* Get the danger */
            p = borg_danger(y, x, 1, true, false);

            /* Increase bravery */
            if (borg.trait[BI_MAXCLEVEL] == 50)
                fear = avoidance * 5 / 10;
            if (borg.trait[BI_MAXCLEVEL] != 50)
                fear = avoidance * 3 / 10;
            if (scaryguy_on_level)
                fear = avoidance * 2;
            if (unique_on_level && vault_on_level
                && borg.trait[BI_MAXCLEVEL] == 50)
                fear = avoidance * 3;
            if (scaryguy_on_level && borg.trait[BI_CLEVEL] <= 5)
                fear = avoidance * 3;
            if (borg.goal.ignoring)
                fear = avoidance * 5;
            if (borg_t - borg_began > 5000)
                fear = avoidance * 25;
            if (borg.trait[BI_FOOD] == 0)
                fear = avoidance * 100;

            /* Normal in town */
            if (borg.trait[BI_CLEVEL] == 0)
                fear = avoidance * 1 / 10;

            /* Avoid dangerous grids (forever) */
            if (p > fear) {
                /* Mark as icky */
                borg_data_icky->data[y][x] = true;

                /* Abort */
                return;
            }
        }

        /* Abort "pointless" paths if possible */
        if (borg_data_cost->data[y][x] <= n)
            break;

        /* Save the new flow cost */
        borg_data_cost->data[y][x] = n;
    }
}